

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  uint uVar1;
  long *plVar2;
  SQUnsignedInteger ni;
  SQFunctionProto *pSVar3;
  SQInteger x;
  SQUnsignedInteger nd;
  SQUnsignedInteger nf;
  ulong uVar4;
  long lVar5;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr refidx;
  
  pSVar3 = SQFunctionProto::Create
                     (this->_ss,this->lang_features,(ulong)(this->_instructions)._size,
                      this->_nliterals,(ulong)(this->_parameters)._size,
                      (ulong)(this->_functions)._size,(ulong)(this->_outervalues)._size,
                      (ulong)(this->_lineinfos)._size,(ulong)(this->_localvarinfos)._size,
                      (ulong)(this->_defaultparams)._size);
  refidx.super_SQObject._unVal.pTable = (SQTable *)0x0;
  refidx.super_SQObject._type = OT_NULL;
  refidx.super_SQObject._flags = '\0';
  refidx.super_SQObject._5_3_ = 0;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  key.super_SQObject._type = OT_NULL;
  key.super_SQObject._flags = '\0';
  key.super_SQObject._5_3_ = 0;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._flags = '\0';
  val.super_SQObject._5_3_ = 0;
  pSVar3->_stacksize = this->_stacksize;
  SQObjectPtr::operator=(&pSVar3->_sourcename,&this->_sourcename);
  pSVar3->_bgenerator = this->_bgenerator;
  SQObjectPtr::operator=(&pSVar3->_name,&this->_name);
  pSVar3->_hoistingLevel = this->_hoistLevel;
  while( true ) {
    x = SQTable::Next((this->_literals).super_SQObject._unVal.pTable,false,&refidx,&key,&val);
    if (x == -1) break;
    SQObjectPtr::operator=(pSVar3->_literals + val.super_SQObject._unVal.nInteger,&key);
    SQObjectPtr::operator=(&refidx,x);
  }
  lVar5 = 0;
  for (uVar4 = 0; uVar4 < (this->_functions)._size; uVar4 = uVar4 + 1) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar3->_functions->super_SQObject)._type + lVar5),
               (SQObjectPtr *)((long)&(((this->_functions)._vals)->super_SQObject)._type + lVar5));
    lVar5 = lVar5 + 0x10;
  }
  lVar5 = 0;
  for (uVar4 = 0; uVar4 < (this->_parameters)._size; uVar4 = uVar4 + 1) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar3->_parameters->super_SQObject)._type + lVar5),
               (SQObjectPtr *)((long)&(((this->_parameters)._vals)->super_SQObject)._type + lVar5));
    lVar5 = lVar5 + 0x10;
  }
  lVar5 = 0;
  for (uVar4 = 0; uVar4 < (this->_outervalues)._size; uVar4 = uVar4 + 1) {
    SQOuterVar::operator=
              ((SQOuterVar *)((long)&pSVar3->_outervalues->_type + lVar5),
               (SQOuterVar *)((long)&((this->_outervalues)._vals)->_type + lVar5));
    lVar5 = lVar5 + 0x30;
  }
  lVar5 = 0;
  for (uVar4 = 0; uVar4 < (this->_localvarinfos)._size; uVar4 = uVar4 + 1) {
    SQLocalVarInfo::operator=
              ((SQLocalVarInfo *)
               ((long)&(pSVar3->_localvarinfos->_name).super_SQObject._type + lVar5),
               (SQLocalVarInfo *)
               ((long)&(((this->_localvarinfos)._vals)->_name).super_SQObject._type + lVar5));
    lVar5 = lVar5 + 0x20;
  }
  for (uVar4 = 0; uVar4 < (this->_lineinfos)._size; uVar4 = uVar4 + 1) {
    pSVar3->_lineinfos[uVar4] = (this->_lineinfos)._vals[uVar4];
  }
  uVar1 = (this->_defaultparams)._size;
  plVar2 = (this->_defaultparams)._vals;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    pSVar3->_defaultparams[uVar4] = plVar2[uVar4];
  }
  memcpy(pSVar3->_instructions,(this->_instructions)._vals,(ulong)(this->_instructions)._size << 3);
  pSVar3->_varparams = (ulong)this->_varparams;
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&key);
  SQObjectPtr::~SQObjectPtr(&refidx);
  return pSVar3;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{
    SQFunctionProto *f=SQFunctionProto::Create(_ss,lang_features,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;
    f->_hoistingLevel = _hoistLevel;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}